

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_variant<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *pcVar6;
  detail *this;
  string_view tag_00;
  string_view tags;
  string_view tags_00;
  uint8_t discriminator;
  char local_39;
  Visitor *local_38;
  
  uVar2 = (ulong)(tag._len != 0);
  this = (detail *)(tag._ptr + uVar2);
  lVar5 = tag._len - uVar2;
  pcVar6 = (char *)0x0;
  if (lVar5 != 0) {
    pcVar6 = (char *)(lVar5 - 1);
  }
  local_38 = visitor;
  std::istream::read((char *)istream,(long)&local_39);
  sVar4 = extraout_RDX;
  for (; local_39 != '\0'; local_39 = local_39 + -1) {
    tags._len = sVar4;
    tags._ptr = pcVar6;
    pcVar3 = (char *)tag_first_size(this,tags);
    if (pcVar6 < pcVar3) {
      pcVar3 = pcVar6;
    }
    this = this + (long)pcVar3;
    pcVar6 = pcVar6 + -(long)pcVar3;
    sVar4 = extraout_RDX_00;
  }
  tags_00._len = sVar4;
  tags_00._ptr = pcVar6;
  sVar4 = tag_first_size(this,tags_00);
  if ((sVar4 != 1) || (iVar1 = bcmp(this,"0",1), iVar1 != 0)) {
    tag_00._len = sVar4;
    tag_00._ptr = (char *)this;
    visit_impl<Visitor,std::ifstream>(full_tag,tag_00,local_38,istream,max_recursion);
  }
  return;
}

Assistant:

void visit_variant(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop <
  tag.remove_suffix(1); // drop >

  std::uint8_t discriminator;
  mserialize::deserialize(discriminator, istream);

  std::uint8_t preceding_tag_count = discriminator;
  while (preceding_tag_count--) { tag_pop(tag); }

  const string_view option_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::VariantBegin{discriminator, option_tag}, istream);
  if (skip) { return; }

  if (option_tag == "0")
  {
    visitor.visit(mserialize::Visitor::Null{});
  }
  else
  {
    visit_impl(full_tag, option_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::VariantEnd{});
}